

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O3

int main(void)

{
  xmlChar *pxVar1;
  size_t __n;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  xmlChar **ppxVar8;
  xmlChar *pxVar9;
  xmlChar ***pppxVar10;
  long lVar11;
  xmlHashTablePtr hash;
  StringPool *pool;
  xmlChar **ppxVar12;
  StringPool *pool_00;
  xmlChar xVar13;
  uint uVar14;
  size_t sVar15;
  int extraout_EDX;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  char **ppcVar19;
  size_t num_keys;
  long lVar20;
  size_t sVar21;
  xmlChar ***pppxVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  xmlChar prefix [40];
  undefined8 uStack_e0;
  xmlChar **local_58 [5];
  
  xmlCheckVersion(0x5398);
  strings1 = (xmlChar **)(*_xmlMalloc)(800000);
  bVar25 = false;
  memset(strings1,0,800000);
  strings2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings2,0,800000);
  test1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test1,0,800000);
  test2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test2,0,800000);
  fill_string_pool(strings1,seeds1);
  ppcVar19 = seeds2;
  ppxVar12 = strings2;
  fill_string_pool(strings2,seeds2);
  ppxVar8 = (xmlChar **)xmlDictCreate();
  if (ppxVar8 == (xmlChar **)0x0) {
    main_cold_22();
  }
  else {
    *test1 = (xmlChar *)0x0;
    lVar20 = 0;
    do {
      pxVar9 = (xmlChar *)xmlDictLookup(ppxVar8,strings1[lVar20],0xffffffff);
      test1[lVar20] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) {
        main_cold_1();
        bVar25 = true;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 10);
    lVar20 = 90000;
    do {
      pxVar9 = strings1[lVar20];
      uVar4 = xmlStrlen(pxVar9);
      pxVar9 = (xmlChar *)xmlDictLookup(ppxVar8,pxVar9,uVar4);
      test1[lVar20] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) {
        main_cold_2();
        bVar25 = true;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x15f9a);
    lVar20 = 0x18696;
    do {
      pxVar9 = strings1[lVar20];
      uVar4 = xmlStrlen(pxVar9);
      pxVar9 = (xmlChar *)xmlDictLookup(ppxVar8,pxVar9,uVar4);
      test1[lVar20] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) {
        main_cold_3();
        bVar25 = true;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
    lVar20 = 0;
    ppxVar12 = test1;
    do {
      if (ppxVar12[lVar20] == (xmlChar *)0x0) {
        pxVar9 = (xmlChar *)xmlDictLookup(ppxVar8,strings1[lVar20],0xffffffff);
        ppxVar12 = test1;
        test1[lVar20] = pxVar9;
        if (pxVar9 == (xmlChar *)0x0) {
          main_cold_4();
          bVar25 = true;
          ppxVar12 = local_58[0];
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
    lVar20 = 0;
    do {
      iVar5 = xmlDictOwns(ppxVar8,test1[lVar20]);
      if (iVar5 == 0) {
        main_cold_5();
        bVar25 = true;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
    lVar20 = 0;
    do {
      pxVar9 = (xmlChar *)xmlDictLookup(ppxVar8,strings1[lVar20],0xffffffff);
      if (pxVar9 != test1[lVar20]) {
        main_cold_6();
        bVar25 = true;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
    lVar20 = 90000;
    do {
      pxVar9 = strings1[lVar20];
      xVar13 = *pxVar9;
      pppxVar10 = local_58;
      while (xVar13 != ':') {
        *(xmlChar *)pppxVar10 = xVar13;
        pppxVar10 = (xmlChar ***)((long)pppxVar10 + 1);
        pxVar1 = pxVar9 + 1;
        pxVar9 = pxVar9 + 1;
        xVar13 = *pxVar1;
      }
      pppxVar22 = (xmlChar ***)(pxVar9 + 1);
      *(undefined1 *)pppxVar10 = 0;
      ppcVar19 = (char **)local_58;
      pxVar9 = (xmlChar *)xmlDictQLookup(ppxVar8,local_58,pppxVar22);
      if (pxVar9 != test1[lVar20]) {
        main_cold_7();
        bVar25 = true;
        ppcVar19 = (char **)pppxVar22;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
    ppxVar12 = ppxVar8;
    lVar20 = xmlDictCreateSub();
    if (lVar20 != 0) {
      *test2 = (xmlChar *)0x0;
      lVar23 = 0;
      bVar2 = false;
      do {
        pxVar9 = (xmlChar *)xmlDictLookup(lVar20,strings2[lVar23],0xffffffff);
        test2[lVar23] = pxVar9;
        if (pxVar9 == (xmlChar *)0x0) {
          main_cold_8();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 10);
      lVar23 = 90000;
      do {
        pxVar9 = strings2[lVar23];
        uVar4 = xmlStrlen(pxVar9);
        pxVar9 = (xmlChar *)xmlDictLookup(lVar20,pxVar9,uVar4);
        test2[lVar23] = pxVar9;
        if (pxVar9 == (xmlChar *)0x0) {
          main_cold_9();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x15f9a);
      lVar23 = 0x18696;
      do {
        pxVar9 = strings2[lVar23];
        uVar4 = xmlStrlen(pxVar9);
        pxVar9 = (xmlChar *)xmlDictLookup(lVar20,pxVar9,uVar4);
        test2[lVar23] = pxVar9;
        if (pxVar9 == (xmlChar *)0x0) {
          main_cold_10();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 0;
      ppxVar12 = test2;
      do {
        if (ppxVar12[lVar23] == (xmlChar *)0x0) {
          pxVar9 = (xmlChar *)xmlDictLookup(lVar20,strings2[lVar23],0xffffffff);
          ppxVar12 = test2;
          test2[lVar23] = pxVar9;
          if (pxVar9 == (xmlChar *)0x0) {
            main_cold_11();
            bVar2 = true;
            ppxVar12 = local_58[0];
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 0;
      do {
        iVar5 = xmlDictOwns(lVar20,test2[lVar23]);
        if (iVar5 == 0) {
          main_cold_12();
          bVar2 = true;
        }
        iVar5 = xmlDictOwns(ppxVar8,test2[lVar23]);
        if (iVar5 != 0) {
          main_cold_13();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 0;
      do {
        iVar5 = xmlDictOwns(lVar20,test1[lVar23]);
        if (iVar5 == 0) {
          main_cold_14();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 0;
      do {
        pxVar9 = (xmlChar *)xmlDictLookup(lVar20,strings2[lVar23],0xffffffff);
        if (pxVar9 != test2[lVar23]) {
          main_cold_15();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 0;
      do {
        pxVar9 = (xmlChar *)xmlDictLookup(lVar20,strings1[lVar23],0xffffffff);
        if (pxVar9 != test1[lVar23]) {
          main_cold_16();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 90000;
      do {
        pxVar9 = strings2[lVar23];
        xVar13 = *pxVar9;
        pppxVar10 = local_58;
        while (xVar13 != ':') {
          *(xmlChar *)pppxVar10 = xVar13;
          pppxVar10 = (xmlChar ***)((long)pppxVar10 + 1);
          pxVar1 = pxVar9 + 1;
          pxVar9 = pxVar9 + 1;
          xVar13 = *pxVar1;
        }
        *(xmlChar *)pppxVar10 = '\0';
        pxVar9 = (xmlChar *)xmlDictQLookup(lVar20,local_58,pxVar9 + 1);
        if (pxVar9 != test2[lVar23]) {
          main_cold_17();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      lVar23 = 90000;
      do {
        pxVar9 = strings1[lVar23];
        xVar13 = *pxVar9;
        pppxVar10 = local_58;
        while (xVar13 != ':') {
          *(xmlChar *)pppxVar10 = xVar13;
          pppxVar10 = (xmlChar ***)((long)pppxVar10 + 1);
          pxVar1 = pxVar9 + 1;
          pxVar9 = pxVar9 + 1;
          xVar13 = *pxVar1;
        }
        *(xmlChar *)pppxVar10 = '\0';
        xmlDictQLookup(lVar20,local_58,pxVar9 + 1);
        pxVar9 = (xmlChar *)xmlDictQLookup(lVar20,local_58,pxVar9 + 1);
        if (pxVar9 != test1[lVar23]) {
          main_cold_18();
          bVar2 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100000);
      xmlDictFree(lVar20);
      xmlDictFree(ppxVar8);
      lVar20 = 0;
      ppxVar12 = strings1;
      do {
        if (ppxVar12[lVar20] != (xmlChar *)0x0) {
          (*_xmlFree)();
          ppxVar12 = strings1;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 100000);
      lVar20 = 0;
      ppxVar12 = strings2;
      do {
        if (ppxVar12[lVar20] != (xmlChar *)0x0) {
          (*_xmlFree)();
          ppxVar12 = strings2;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 100000);
      (*_xmlFree)(strings1);
      (*_xmlFree)(strings2);
      (*_xmlFree)(test1);
      (*_xmlFree)(test2);
      if (bVar2 || bVar25) {
        main_cold_19();
      }
      uVar14 = (uint)(bVar2 || bVar25);
      sVar21 = 1;
      do {
        uVar18 = 1000;
        if (sVar21 == 1) {
          uVar18 = 100000;
        }
        uVar24 = 10;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar24;
          lVar20 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar3,0);
          if (1000 < uVar24) {
            lVar20 = 1;
          }
          for (; lVar20 != 0; lVar20 = lVar20 + -1) {
            iVar5 = test_hash(uVar24,sVar21,0);
            if (iVar5 != 0) goto LAB_00103077;
          }
          iVar5 = test_hash(uVar24,sVar21,1);
          if (iVar5 != 0) {
LAB_00103077:
            main_cold_20();
            uVar14 = 1;
            goto LAB_00103081;
          }
          uVar24 = uVar24 * 10;
        } while (uVar24 <= uVar18);
        sVar21 = sVar21 + 1;
        if (sVar21 == 4) {
LAB_00103081:
          xmlCleanupParser();
          return uVar14;
        }
      } while( true );
    }
  }
  main_cold_21();
  ppxVar8 = (xmlChar **)*ppcVar19;
  if (ppxVar8 == (xmlChar **)0x0) {
    uVar18 = 0;
LAB_0010310b:
    uVar18 = uVar18 & 0xffffffff;
    uVar14 = 0;
    iVar5 = 0;
    do {
      lVar20 = (long)iVar5;
      uVar24 = (ulong)uVar14;
      pxVar9 = (xmlChar *)xmlStrncatNew(ppxVar12[lVar20],ppxVar12[uVar24],0xffffffff);
      ppxVar12[uVar18] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) goto LAB_0010326c;
      iVar7 = xmlStrlen(pxVar9);
      if (0x1e < iVar7) goto LAB_00103271;
      bVar25 = 0x30 < iVar5;
      bVar2 = 0x30 < iVar5;
      iVar5 = iVar5 + 1;
      if (bVar2) {
        iVar5 = 0;
      }
      uVar14 = bVar25 + uVar14;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 90000);
    uVar18 = 90000;
  }
  else {
    pppxVar10 = (xmlChar ***)ppcVar19;
    uVar18 = 0;
    do {
      uVar24 = uVar18;
      pxVar9 = (xmlChar *)xmlStrdup();
      ppxVar12[uVar24] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) {
        fill_string_pool_cold_1();
        goto LAB_0010329f;
      }
      ppxVar8 = ((xmlChar ***)ppcVar19)[uVar24 + 1];
      uVar18 = uVar24 + 1;
    } while (ppxVar8 != (xmlChar **)0x0);
    if (uVar24 < 89999) goto LAB_0010310b;
    if (0x1869e < uVar24) goto LAB_00103258;
  }
  uVar6 = 99999 - (int)uVar18;
  uVar14 = 499;
  if (uVar6 < 499) {
    uVar14 = uVar6;
  }
  lVar23 = 0;
  lVar20 = 0;
  uVar24 = 0;
  do {
    iVar5 = (int)uVar24;
    lVar11 = xmlStrncatNew(ppxVar12[iVar5],":",0xffffffff);
    *(long *)((long)ppxVar12 + lVar23 + (uVar18 & 0xffffffff) * 8) = lVar11;
    if (lVar11 == 0) {
      fill_string_pool_cold_3();
LAB_0010326c:
      fill_string_pool_cold_4();
LAB_00103271:
      fprintf(_stderr,"### %s %s\n",ppxVar12[lVar20 + 90000],ppxVar12[uVar24]);
      abort();
    }
    uVar6 = iVar5 + 1;
    if (0x15f8e < iVar5) {
      uVar6 = 0;
    }
    lVar20 = lVar20 + -1;
    lVar23 = lVar23 + 8;
    uVar24 = (ulong)uVar6;
  } while (uVar14 * 8 + 8 != (int)lVar23);
  lVar20 = (uVar18 & 0xffffffff) - lVar20;
  uVar24 = lVar20 - 1;
  if (uVar24 < 99999) {
    uVar18 = 0;
    uVar24 = 0;
    do {
      iVar5 = (int)uVar24;
      ppxVar8 = (xmlChar **)ppxVar12[(long)iVar5 + 90000];
      iVar7 = (int)uVar18;
      pppxVar10 = (xmlChar ***)ppxVar12[iVar7];
      pxVar9 = (xmlChar *)xmlStrncatNew(ppxVar8,pppxVar10,0xffffffff);
      ppxVar12[lVar20] = pxVar9;
      if (pxVar9 == (xmlChar *)0x0) {
LAB_0010329f:
        fill_string_pool_cold_2();
        if (extraout_EDX == 0) {
          uStack_e0 = 0;
          hash = (xmlHashTablePtr)xmlHashCreate(0);
        }
        else {
          uStack_e0 = xmlDictCreate();
          hash = (xmlHashTablePtr)xmlHashCreateDict(0);
        }
        pool = (StringPool *)(*_xmlMalloc)(0x30);
        pool->num_entries = (size_t)ppxVar8;
        pool->num_keys = (size_t)pppxVar10;
        sVar21 = (long)pppxVar10 * (long)ppxVar8;
        __n = sVar21 * 8;
        ppxVar12 = (xmlChar **)(*_xmlMalloc)(__n);
        pool->strings = ppxVar12;
        memset(ppxVar12,0,__n);
        pool->num_strings = sVar21;
        pool->index = 0;
        pool->id = '1';
        pool_00 = (StringPool *)(*_xmlMalloc)(0x30);
        pool_00->num_entries = (size_t)ppxVar8;
        pool_00->num_keys = (size_t)pppxVar10;
        iVar5 = 0;
        ppxVar12 = (xmlChar **)(*_xmlMalloc)(__n);
        pool_00->strings = ppxVar12;
        memset(ppxVar12,0,__n);
        pool_00->num_strings = sVar21;
        pool_00->index = 0;
        pool_00->id = '2';
        if (sVar21 != 0) {
          iVar5 = 0;
          do {
            uVar14 = rng_state_0 * -0x61c88645;
            uVar16 = rng_state_0 * -0x3910c8a0;
            uVar6 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
            rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
            iVar7 = pool_bulk_insert(pool,hash,(ulong)(((uVar14 >> 0x1b | uVar16) * 5) % 0x32));
            if (iVar7 != 0) {
              test_hash_cold_1();
              iVar5 = 1;
            }
            uVar14 = rng_state_0 * -0x61c88645;
            uVar16 = rng_state_0 * -0x3910c8a0;
            uVar6 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
            rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
            iVar7 = pool_bulk_insert(pool_00,hash,(ulong)(((uVar14 >> 0x1b | uVar16) * 5) % 100));
            if (iVar7 != 0) {
              test_hash_cold_2();
              iVar5 = 1;
            }
          } while (pool_00->index < pool_00->num_strings);
        }
        pool_00->index = 0;
        iVar7 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,1);
        if (iVar7 != 0) {
          test_hash_cold_3();
          iVar5 = 1;
        }
        pool_00->index = 0;
        uVar14 = rng_state_0;
        do {
          do {
            rng_state_0 = uVar14;
            if ((pool->num_strings <= pool->index) && (pool_00->num_strings <= pool_00->index)) {
              pool->index = 0;
              iVar7 = pool_bulk_lookup(pool,hash,pool->num_entries,1);
              if (iVar7 != 0) {
                test_hash_cold_4();
                iVar5 = 1;
              }
              pool_00->index = 0;
              iVar7 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,0);
              if (iVar7 != 0) {
                test_hash_cold_5();
                iVar5 = 1;
              }
              pool_free(pool);
              pool_free(pool_00);
              xmlHashFree(hash,0);
              xmlDictFree(uStack_e0);
              return iVar5;
            }
            uVar14 = rng_state_0 * -0x61c88645;
            uVar16 = rng_state_0 * -0x3910c8a0;
            uVar6 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
            rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
            iVar7 = pool_bulk_insert(pool,hash,(ulong)(((uVar14 >> 0x1b | uVar16) * 5) % 0x32));
            if (iVar7 != 0) {
              test_hash_cold_6();
              iVar5 = 1;
            }
            uVar6 = rng_state_1 ^ rng_state_0;
            uVar14 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
            rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
            sVar21 = pool_00->num_strings;
            uVar18 = pool_00->index;
          } while ((sVar21 <= uVar18) ||
                  (uVar6 = ((rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 * -0x3910c8a0) * 5) %
                           100, uVar6 == 0));
          sVar15 = pool_00->num_keys;
          uVar24 = 1;
          uVar16 = 0;
          rng_state_0 = uVar14;
          do {
            ppxVar12 = pool_00->strings;
            if (sVar15 == 3) {
              iVar7 = xmlHashRemoveEntry3(hash,ppxVar12[uVar18],ppxVar12[uVar18 + 1],
                                          ppxVar12[uVar18 + 2],0);
LAB_001035f3:
              uVar17 = -(uint)(iVar7 != 0) | uVar16;
              sVar15 = pool_00->num_keys;
              sVar21 = pool_00->num_strings;
            }
            else {
              if (sVar15 == 2) {
                iVar7 = xmlHashRemoveEntry2(hash,ppxVar12[uVar18],ppxVar12[uVar18 + 1],0);
                goto LAB_001035f3;
              }
              uVar17 = 0xffffffff;
              if (sVar15 == 1) {
                iVar7 = xmlHashRemoveEntry(hash,ppxVar12[uVar18],0);
                goto LAB_001035f3;
              }
            }
            uVar18 = uVar18 + sVar15;
          } while ((uVar18 < sVar21) &&
                  (bVar25 = uVar24 < uVar6, uVar24 = uVar24 + 1, uVar16 = uVar17, bVar25));
          pool_00->index = uVar18;
          uVar14 = rng_state_0;
          if (uVar17 != 0) {
            test_hash_cold_7();
            iVar5 = 1;
            uVar14 = rng_state_0;
          }
        } while( true );
      }
      uVar24 = (ulong)(iVar5 + 1);
      if (0x1f2 < iVar5) {
        uVar24 = 0;
      }
      uVar18 = (ulong)(iVar7 + 5);
      if (0x15f8a < iVar7) {
        uVar18 = 0;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100000);
  }
LAB_00103258:
  return (int)uVar24;
}

Assistant:

int
main(void) {
    int ret = 0;

    LIBXML_TEST_VERSION

    if (testall_dict() != 0) {
        fprintf(stderr, "dictionary tests failed\n");
        ret = 1;
    }
    if (testall_hash() != 0) {
        fprintf(stderr, "hash tests failed\n");
        ret = 1;
    }

    xmlCleanupParser();
    return(ret);
}